

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ExtensionSet::GetString
          (ExtensionSet *this,int number,string *default_value)

{
  Extension *pEVar1;
  string *in_RDX;
  Extension *extension;
  int in_stack_ffffffffffffff44;
  ExtensionSet *in_stack_ffffffffffffff48;
  string *local_8;
  
  pEVar1 = FindOrNull(in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
  local_8 = in_RDX;
  if ((pEVar1 != (Extension *)0x0) && ((pEVar1->field_0xa & 1) == 0)) {
    local_8 = (string *)(pEVar1->field_0).int64_value;
  }
  return local_8;
}

Assistant:

const std::string& ExtensionSet::GetString(
    int number, const std::string& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == NULL || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
    return *extension->string_value;
  }
}